

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

spv_result_t spvtools::val::ValidateExtInstImport(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  long lVar2;
  spv_result_t unaff_EBP;
  string name;
  string local_220;
  DiagnosticStream local_200;
  
  if ((_->version_ < 0x10501) &&
     (bVar1 = EnumSet<spvtools::Extension>::contains
                        (&_->module_extensions_,kSPV_KHR_non_semantic_info), !bVar1)) {
    Instruction::GetOperandAs<std::__cxx11::string>(&local_220,inst,1);
    lVar2 = std::__cxx11::string::find((char *)&local_220,0x25dd25,0);
    if (lVar2 == 0) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,
                 "NonSemantic extended instruction sets cannot be declared without SPV_KHR_non_semantic_info."
                 ,0x5b);
      DiagnosticStream::~DiagnosticStream(&local_200);
      unaff_EBP = local_200.error_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if (lVar2 == 0) {
      return unaff_EBP;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateExtInstImport(ValidationState_t& _,
                                   const Instruction* inst) {
  const auto name_id = 1;
  if (_.version() <= SPV_SPIRV_VERSION_WORD(1, 5) &&
      !_.HasExtension(kSPV_KHR_non_semantic_info)) {
    const std::string name = inst->GetOperandAs<std::string>(name_id);
    if (name.find("NonSemantic.") == 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "NonSemantic extended instruction sets cannot be declared "
                "without SPV_KHR_non_semantic_info.";
    }
  }

  return SPV_SUCCESS;
}